

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::show_stats
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,ostream *os,
          int n)

{
  uint64_t uVar1;
  string *indent_00;
  string *in_RSI;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_RDI;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [16];
  undefined1 in_ZMM1 [64];
  string indent;
  char (*in_stack_ffffffffffffff48) [19];
  char *in_stack_ffffffffffffff50;
  string *os_00;
  string *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  string *os_01;
  undefined8 in_stack_ffffffffffffff78;
  int n_00;
  ostream *in_stack_ffffffffffffffb8;
  split_mix_hasher *in_stack_ffffffffffffffc0;
  string local_38 [40];
  string *local_10;
  
  auVar3 = in_ZMM1._0_16_;
  auVar2 = in_ZMM0._0_16_;
  local_10 = in_RSI;
  get_indent_abi_cxx11_((int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  show_stat<char[19]>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                      in_stack_ffffffffffffff48);
  uVar1 = size(in_RDI);
  auVar2 = vcvtusi2sd_avx512f(auVar2,uVar1);
  uVar1 = capa_size((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                    0x142263);
  auVar3 = vcvtusi2sd_avx512f(auVar3,uVar1);
  n_00 = (int)((ulong)((auVar2._0_8_ / auVar3._0_8_) * 100.0) >> 0x20);
  show_stat<double>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                    (double *)in_stack_ffffffffffffff48);
  show_stat<unsigned_int>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (uint *)in_stack_ffffffffffffff48);
  os_01 = local_10;
  size(in_RDI);
  show_stat<unsigned_long>
            ((ostream *)os_01,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (unsigned_long *)in_stack_ffffffffffffff48);
  os_00 = local_10;
  indent_00 = (string *)
              capa_size((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                        0x14232f);
  show_stat<unsigned_long>
            ((ostream *)os_01,indent_00,(char *)os_00,(unsigned_long *)in_stack_ffffffffffffff48);
  alloc_bytes((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0x142376);
  show_stat<unsigned_long>((ostream *)os_01,indent_00,(char *)os_00,(unsigned_long *)local_10);
  show_member((ostream *)os_00,local_10,(char *)0x1423b6);
  bijective_hash::split_mix_hasher::show_stats
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,n_00);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_hash_table");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "capa_size", capa_size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "num_resize", num_resize_);
#endif
        show_member(os, indent, "hasher_");
        hasher_.show_stats(os, n + 1);
    }